

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Disposer::dispose<kj::_::WeakFulfiller<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
          (Disposer *this,WeakFulfiller<NoCopy> *object)

{
  _func_int *local_30;
  WeakFulfiller<NoCopy> *object_local;
  Disposer *this_local;
  
  if (object == (WeakFulfiller<NoCopy> *)0x0) {
    local_30 = (_func_int *)0x0;
  }
  else {
    local_30 = (object->super_PromiseFulfiller<NoCopy>).super_PromiseRejector._vptr_PromiseRejector
               [-2] + (long)&(object->super_PromiseFulfiller<NoCopy>).super_PromiseRejector.
                             _vptr_PromiseRejector;
  }
  (**this->_vptr_Disposer)(this,local_30);
  return;
}

Assistant:

void Disposer::dispose(T* object) const {
  if constexpr (_kj_internal_isPolymorphic((T*)nullptr)) {
    // Note that dynamic_cast<void*> does not require RTTI to be enabled, because the offset to
    // the top of the object is in the vtable -- as it obviously needs to be to correctly implement
    // operator delete.
    disposeImpl(dynamic_cast<void*>(object));
  } else {
    disposeImpl(static_cast<void*>(object));
  }
}